

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::FreeZeroObjVariablePS::execute
          (FreeZeroObjVariablePS *this,VectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *s,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  double dVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  VarStatus VVar5;
  double *pdVar6;
  VarStatus *pVVar7;
  char *pcVar8;
  DSVectorBase<double> *pDVar9;
  SVectorBase<double> *pSVar10;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  int __c_06;
  int __c_07;
  int __c_08;
  long *in_RDI;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_R9;
  double dVar11;
  double dVar12;
  DSVectorBase<double> *in_stack_00000008;
  int k_5;
  int idx;
  int k_4;
  int k_3;
  double lo;
  double z_1;
  double scale_1;
  int l_1;
  SVectorBase<double> *row_1;
  double val_1;
  int k_2;
  double maxRowLo;
  double up;
  double z;
  double scale;
  int l;
  SVectorBase<double> *row;
  double val;
  int k_1;
  double minRowUp;
  DSVectorBase<double> slack;
  int domIdx;
  int rIdx_new;
  int k;
  int rIdx;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  DSVectorBase<double> *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  DSVectorBase<double> *in_stack_fffffffffffffd80;
  uint local_108;
  uint local_100;
  uint local_fc;
  double local_f0;
  double local_e8;
  uint local_dc;
  double local_d0;
  uint local_c4;
  double local_c0;
  double local_b0;
  double local_a8;
  uint local_9c;
  double local_90;
  uint local_74;
  double local_70;
  uint local_44;
  uint local_3c;
  int local_38;
  
  if ((int)in_RDI[5] != *(int *)((long)in_RDI + 0x2c)) {
    pdVar6 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    dVar11 = *pdVar6;
    pdVar6 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    *pdVar6 = dVar11;
    pdVar6 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    dVar11 = *pdVar6;
    pdVar6 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    *pdVar6 = dVar11;
    pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[5]);
    VVar5 = *pVVar7;
    pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (in_R9,*(int *)((long)in_RDI + 0x2c));
    *pVVar7 = VVar5;
  }
  lVar2 = in_RDI[6];
  local_38 = SVectorBase<double>::size((SVectorBase<double> *)(in_RDI + 9));
  local_38 = (int)lVar2 - local_38;
  local_3c = 0;
  while( true ) {
    local_38 = local_38 + 1;
    iVar4 = SVectorBase<double>::size((SVectorBase<double> *)(in_RDI + 9));
    if (iVar4 <= (int)local_3c) break;
    pcVar8 = SVectorBase<double>::index
                       ((SVectorBase<double> *)(in_RDI + 9),(char *)(ulong)local_3c,__c);
    pdVar6 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    dVar11 = *pdVar6;
    pdVar6 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    *pdVar6 = dVar11;
    pdVar6 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    dVar11 = *pdVar6;
    pdVar6 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    *pdVar6 = dVar11;
    pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_00000008,
                        (int)pcVar8);
    VVar5 = *pVVar7;
    pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_00000008,
                        local_38);
    *pVVar7 = VVar5;
    local_3c = local_3c + 1;
  }
  local_44 = 0xffffffff;
  SVectorBase<double>::size((SVectorBase<double> *)(in_RDI + 9));
  DSVectorBase<double>::DSVectorBase(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
  if ((*(byte *)(in_RDI + 0x17) & 1) == 0) {
    pdVar6 = (double *)infinity();
    local_c0 = -*pdVar6;
    for (local_c4 = 0;
        iVar4 = Array<soplex::DSVectorBase<double>_>::size
                          ((Array<soplex::DSVectorBase<double>_> *)0x2c528e), (int)local_c4 < iVar4;
        local_c4 = local_c4 + 1) {
      local_d0 = 0.0;
      pDVar9 = Array<soplex::DSVectorBase<double>_>::operator[]
                         ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffffd70,
                          in_stack_fffffffffffffd6c);
      pSVar10 = &pDVar9->super_SVectorBase<double>;
      for (local_dc = 0; iVar4 = SVectorBase<double>::size(pSVar10), (int)local_dc < iVar4;
          local_dc = local_dc + 1) {
        pcVar8 = SVectorBase<double>::index(pSVar10,(char *)(ulong)local_dc,__c_02);
        if ((int)pcVar8 != (int)in_RDI[5]) {
          pdVar6 = SVectorBase<double>::value(pSVar10,local_dc);
          dVar11 = *pdVar6;
          SVectorBase<double>::index(pSVar10,(char *)(ulong)local_dc,__c_03);
          pdVar6 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffd70,
                              in_stack_fffffffffffffd6c);
          local_d0 = dVar11 * *pdVar6 + local_d0;
        }
      }
      SVectorBase<double>::operator[]
                ((SVectorBase<double> *)
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                 (int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
      local_e8 = maxAbs((Real)in_stack_fffffffffffffd80,
                        (Real)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      if (local_e8 < 1.0) {
        local_e8 = 1.0;
      }
      dVar11 = SVectorBase<double>::operator[]
                         ((SVectorBase<double> *)
                          CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                          (int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
      local_f0 = dVar11 / local_e8 - local_d0 / local_e8;
      (**(code **)(*in_RDI + 0x38))();
      bVar3 = isZero<double,double>
                        ((double)in_stack_fffffffffffffd70,
                         (double)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      if (bVar3) {
        local_f0 = 0.0;
      }
      dVar11 = SVectorBase<double>::operator[]
                         ((SVectorBase<double> *)
                          CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                          (int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
      dVar11 = (local_f0 * local_e8) / dVar11;
      DSVectorBase<double>::add
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
                 (double *)in_stack_fffffffffffffd70);
      if (local_c0 < dVar11) {
        local_44 = local_c4;
        local_c0 = dVar11;
      }
    }
    if ((double)in_RDI[7] <= local_c0) {
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c)
      ;
      *pdVar6 = local_c0;
    }
    else {
      dVar11 = (double)in_RDI[7];
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c)
      ;
      *pdVar6 = dVar11;
      local_44 = 0xffffffff;
    }
  }
  else {
    pdVar6 = (double *)infinity();
    local_70 = *pdVar6;
    for (local_74 = 0;
        iVar4 = Array<soplex::DSVectorBase<double>_>::size
                          ((Array<soplex::DSVectorBase<double>_> *)0x2c4e5e), (int)local_74 < iVar4;
        local_74 = local_74 + 1) {
      local_90 = 0.0;
      pDVar9 = Array<soplex::DSVectorBase<double>_>::operator[]
                         ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffffd70,
                          in_stack_fffffffffffffd6c);
      pSVar10 = &pDVar9->super_SVectorBase<double>;
      for (local_9c = 0; iVar4 = SVectorBase<double>::size(pSVar10), (int)local_9c < iVar4;
          local_9c = local_9c + 1) {
        pcVar8 = SVectorBase<double>::index(pSVar10,(char *)(ulong)local_9c,__c_00);
        if ((int)pcVar8 != (int)in_RDI[5]) {
          pdVar6 = SVectorBase<double>::value(pSVar10,local_9c);
          dVar11 = *pdVar6;
          SVectorBase<double>::index(pSVar10,(char *)(ulong)local_9c,__c_01);
          pdVar6 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffd70,
                              in_stack_fffffffffffffd6c);
          local_90 = dVar11 * *pdVar6 + local_90;
        }
      }
      SVectorBase<double>::operator[]
                ((SVectorBase<double> *)
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                 (int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
      local_a8 = maxAbs((Real)in_stack_fffffffffffffd80,
                        (Real)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      if (local_a8 < 1.0) {
        local_a8 = 1.0;
      }
      dVar11 = SVectorBase<double>::operator[]
                         ((SVectorBase<double> *)
                          CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                          (int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
      local_b0 = dVar11 / local_a8 - local_90 / local_a8;
      (**(code **)(*in_RDI + 0x38))();
      bVar3 = isZero<double,double>
                        ((double)in_stack_fffffffffffffd70,
                         (double)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      if (bVar3) {
        local_b0 = 0.0;
      }
      dVar11 = SVectorBase<double>::operator[]
                         ((SVectorBase<double> *)
                          CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                          (int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
      dVar11 = (local_b0 * local_a8) / dVar11;
      DSVectorBase<double>::add
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
                 (double *)in_stack_fffffffffffffd70);
      if (dVar11 < local_70) {
        local_44 = local_74;
        local_70 = dVar11;
      }
    }
    if (local_70 <= (double)in_RDI[7]) {
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c)
      ;
      *pdVar6 = local_70;
    }
    else {
      dVar11 = (double)in_RDI[7];
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c)
      ;
      *pdVar6 = dVar11;
      local_44 = 0xffffffff;
    }
  }
  for (local_fc = 0; iVar4 = SVectorBase<double>::size((SVectorBase<double> *)(in_RDI + 9)),
      (int)local_fc < iVar4; local_fc = local_fc + 1) {
    dVar12 = SVectorBase<double>::operator[]
                       ((SVectorBase<double> *)
                        CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                        (int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
    pdVar6 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 9),local_fc);
    dVar11 = *pdVar6;
    pdVar6 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    dVar1 = *pdVar6;
    SVectorBase<double>::index((SVectorBase<double> *)(in_RDI + 9),(char *)(ulong)local_fc,__c_04);
    pdVar6 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    *pdVar6 = dVar12 + dVar11 * dVar1;
  }
  pdVar6 = VectorBase<double>::operator[]
                     ((VectorBase<double> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
  *pdVar6 = 0.0;
  for (local_100 = 0; iVar4 = SVectorBase<double>::size((SVectorBase<double> *)(in_RDI + 9)),
      (int)local_100 < iVar4; local_100 = local_100 + 1) {
    SVectorBase<double>::index((SVectorBase<double> *)(in_RDI + 9),(char *)(ulong)local_100,__c_05);
    dVar11 = SVectorBase<double>::operator[]
                       ((SVectorBase<double> *)
                        CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                        (int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
    pdVar6 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    *pdVar6 = dVar11;
  }
  for (local_108 = 0; iVar4 = SVectorBase<double>::size((SVectorBase<double> *)(in_RDI + 9)),
      (int)local_108 < iVar4; local_108 = local_108 + 1) {
    if (local_108 == local_44) {
      pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[5])
      ;
      *pVVar7 = BASIC;
      if ((*(byte *)(in_RDI + 0x17) & 1) == 0) {
        pdVar6 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 9),local_108);
        VVar5 = (VarStatus)(0.0 < *pdVar6);
        in_stack_fffffffffffffd70 = in_stack_00000008;
        pcVar8 = SVectorBase<double>::index
                           ((SVectorBase<double> *)(in_RDI + 9),(char *)(ulong)local_108,__c_08);
        pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                            in_stack_fffffffffffffd70,(int)pcVar8);
        *pVVar7 = VVar5;
      }
      else {
        pdVar6 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 9),local_108);
        dVar11 = *pdVar6;
        pDVar9 = in_stack_00000008;
        pcVar8 = SVectorBase<double>::index
                           ((SVectorBase<double> *)(in_RDI + 9),(char *)(ulong)local_108,__c_07);
        pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)pDVar9,
                            (int)pcVar8);
        *pVVar7 = (uint)(dVar11 <= 0.0);
      }
    }
    else {
      pcVar8 = SVectorBase<double>::index
                         ((SVectorBase<double> *)(in_RDI + 9),(char *)(ulong)local_108,__c_06);
      pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_00000008,
                          (int)pcVar8);
      *pVVar7 = BASIC;
    }
  }
  if (local_44 == 0xffffffff) {
    if ((*(byte *)(in_RDI + 0x17) & 1) == 0) {
      pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[5])
      ;
      *pVVar7 = ON_LOWER;
    }
    else {
      pVVar7 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[5])
      ;
      *pVVar7 = ON_UPPER;
    }
  }
  DSVectorBase<double>::~DSVectorBase(in_stack_fffffffffffffd70);
  return;
}

Assistant:

void SPxMainSM<R>::FreeZeroObjVariablePS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   int rIdx = m_old_i - m_col.size() + 1;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int rIdx_new = m_col.index(k);
      s[rIdx] = s[rIdx_new];
      y[rIdx] = y[rIdx_new];
      rStatus[rIdx] = rStatus[rIdx_new];
      rIdx++;
   }

   // primal:
   int      domIdx = -1;
   DSVectorBase<R> slack(m_col.size());

   if(m_loFree)
   {
      R minRowUp = R(infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R           val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R up = z * scale / row[m_j];
         slack.add(k, val);

         if(up < minRowUp)
         {
            minRowUp = up;
            domIdx   = k;
         }
      }

      if(m_bnd < minRowUp)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = minRowUp;
   }
   else
   {
      R maxRowLo = R(-infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R lo = z * scale / row[m_j];
         slack.add(k, val);

         if(lo > maxRowLo)
         {
            maxRowLo = lo;
            domIdx   = k;
         }
      }

      if(m_bnd > maxRowLo)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = maxRowLo;
   }

   for(int k = 0; k < m_col.size(); ++k)
      s[m_col.index(k)] = slack[k] + m_col.value(k) * x[m_j];

   // dual:
   r[m_j] = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int idx = m_col.index(k);
      y[idx] = m_rowObj[idx];
   }

   // basis:
   for(int k = 0; k < m_col.size(); ++k)
   {
      if(k != domIdx)
         rStatus[m_col.index(k)] = SPxSolverBase<R>::BASIC;

      else
      {
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

         if(m_loFree)
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_UPPER :
                                      SPxSolverBase<R>::ON_LOWER;
         else
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_LOWER :
                                      SPxSolverBase<R>::ON_UPPER;
      }
   }

   if(domIdx == -1)
   {
      if(m_loFree)
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM20 Dimension doesn't match after this step.");
   }

#endif
}